

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O0

void * DrawerCommandQueue::AllocMemory(size_t size)

{
  ulong uVar1;
  DrawerCommandQueue *pDVar2;
  void *data;
  DrawerCommandQueue *queue;
  size_t size_local;
  
  uVar1 = size + 0xf & 0xfffffffffffffff0;
  pDVar2 = Instance();
  if (pDVar2->memorypool_pos + uVar1 < 0x1000001) {
    size_local = (size_t)(pDVar2->memorypool + pDVar2->memorypool_pos);
    pDVar2->memorypool_pos = uVar1 + pDVar2->memorypool_pos;
  }
  else {
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

void* DrawerCommandQueue::AllocMemory(size_t size)
{
	// Make sure allocations remain 16-byte aligned
	size = (size + 15) / 16 * 16;

	auto queue = Instance();
	if (queue->memorypool_pos + size > memorypool_size)
		return nullptr;

	void *data = queue->memorypool + queue->memorypool_pos;
	queue->memorypool_pos += size;
	return data;
}